

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O3

void set_destroy(set s)

{
  void *__ptr;
  ulong uVar1;
  bucket __ptr_00;
  long lVar2;
  ulong uVar3;
  
  if (s != (set)0x0) {
    __ptr_00 = s->buckets;
    if (__ptr_00 != (bucket)0x0) {
      uVar1 = s->capacity;
      if (uVar1 != 0) {
        lVar2 = 0x10;
        uVar3 = 0;
        do {
          __ptr = *(void **)((long)&s->buckets->count + lVar2);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            uVar1 = s->capacity;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x18;
        } while (uVar3 < uVar1);
        __ptr_00 = s->buckets;
      }
      free(__ptr_00);
    }
    free(s);
    return;
  }
  return;
}

Assistant:

void set_destroy(set s)
{
	if (s == NULL)
	{
		return;
	}

	if (s->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < s->capacity; ++iterator)
		{
			bucket b = &s->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(s->buckets);
	}

	free(s);
}